

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_form.c
# Opt level: O2

int dwarf_get_debug_str_index(Dwarf_Attribute attr,Dwarf_Unsigned *return_index,Dwarf_Error *error)

{
  ushort uVar1;
  ulong uVar2;
  Dwarf_Debug dbg_00;
  Dwarf_CU_Context_conflict pDVar3;
  int iVar4;
  Dwarf_Byte_Ptr section_end;
  ulong uVar5;
  int iVar6;
  Dwarf_Unsigned index;
  Dwarf_Debug dbg;
  Dwarf_CU_Context_conflict cu_context;
  
  uVar1 = attr->ar_attribute_form;
  cu_context = (Dwarf_CU_Context_conflict)0x0;
  dbg = (Dwarf_Debug)0x0;
  index = 0;
  iVar4 = get_attr_dbg(&dbg,&cu_context,attr,error);
  pDVar3 = cu_context;
  iVar6 = 1;
  if (iVar4 == 0) {
    section_end = _dwarf_calculate_info_section_end_ptr(cu_context);
    dbg_00 = dbg;
    iVar4 = dw_read_str_index_val_itself
                      (dbg,(uint)uVar1,attr->ar_debug_ptr,section_end,&index,error);
    if (iVar4 == 0) {
      *return_index = index;
      iVar6 = 0;
    }
    else {
      uVar2 = (dbg_00->de_debug_str_offsets).dss_size;
      if ((uVar2 < index) ||
         (uVar5 = index * pDVar3->cc_length_size, uVar2 <= uVar5 && uVar5 - uVar2 != 0)) {
        _dwarf_error_string(dbg_00,error,0x74,
                            "DW_DLE_ATTR_FORM_SIZE_BAD: An Attribute Value (index  into .debug_str_offsets) is Impossibly large. Corrupt Dwarf."
                           );
      }
    }
  }
  return iVar6;
}

Assistant:

int
dwarf_get_debug_str_index(Dwarf_Attribute attr,
    Dwarf_Unsigned *return_index,
    Dwarf_Error *error)
{
    int theform = attr->ar_attribute_form;
    Dwarf_CU_Context cu_context = 0;
    Dwarf_Debug dbg = 0;
    int res  = 0;
    Dwarf_Byte_Ptr section_end =  0;
    Dwarf_Unsigned index = 0;
    Dwarf_Small *info_ptr = 0;
    int indxres = 0;
    Dwarf_Unsigned length_size = 0;
    Dwarf_Unsigned sectionlen = 0;

    res = get_attr_dbg(&dbg,&cu_context,attr,error);
    if (res != DW_DLV_OK) {
        return res;
    }
    section_end =
        _dwarf_calculate_info_section_end_ptr(cu_context);
    info_ptr = attr->ar_debug_ptr;

    indxres = dw_read_str_index_val_itself(dbg, theform, info_ptr,
        section_end, &index,error);
    if (indxres == DW_DLV_OK) {
        *return_index = index;
        return indxres;
    }
    length_size = cu_context->cc_length_size;
    sectionlen = dbg->de_debug_str_offsets.dss_size;
    if (index > sectionlen ||
        (index *length_size) > sectionlen) {
        _dwarf_error_string(dbg, error,
            DW_DLE_ATTR_FORM_SIZE_BAD,
            "DW_DLE_ATTR_FORM_SIZE_BAD: "
            "An Attribute Value (index  into "
            ".debug_str_offsets) is Impossibly "
            "large. Corrupt Dwarf.");
        return DW_DLV_ERROR;
    }
    return indxres;
}